

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool SeedTest<Blob<160>>(pfHash hash,int keycount,bool drawDiagram)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  
  printf("Keyset \'Seed\' - %d keys\n");
  hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::resize(&hashes,(long)keycount);
  lVar2 = 0;
  for (uVar3 = 0; (uint)(~(keycount >> 0x1f) & keycount) != uVar3; uVar3 = uVar3 + 1) {
    (*hash)("The quick brown fox jumps over the lazy dog",0x2b,(uint32_t)uVar3,
            (hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
             super__Vector_impl_data._M_start)->bytes + lVar2);
    lVar2 = lVar2 + 0x14;
  }
  bVar1 = TestHashList<Blob<160>>(&hashes,drawDiagram,true,true,true,true);
  putchar(10);
  std::_Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>);
  return bVar1;
}

Assistant:

bool SeedTest ( pfHash hash, int keycount, bool drawDiagram )
{
  printf("Keyset 'Seed' - %d keys\n",keycount);

  const char * text = "The quick brown fox jumps over the lazy dog";
  const int len = (int)strlen(text);

  //----------

  std::vector<hashtype> hashes;

  hashes.resize(keycount);

  for(int i = 0; i < keycount; i++)
  {
    hash(text,len,i,&hashes[i]);
  }

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);

  printf("\n");

  return result;
}